

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_mem.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  allocator<char> local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c8 [8];
  elfio elffile;
  string local_338;
  undefined1 local_318 [8];
  vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> ranges;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  allocator<char> local_281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  long local_220;
  ifstream proc_maps;
  char **argv_local;
  int argc_local;
  
  if (argc == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"/proc/",&local_281);
    std::operator+(&local_260,&local_280,argv[1]);
    std::operator+(&local_240,&local_260,"/maps");
    std::ifstream::ifstream(&local_220,(string *)&local_240,_S_in);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::vector
                ((vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> *)
                 local_318);
      __s = argv[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_338,__s,(allocator<char> *)((long)&elffile.current_file_pos + 7));
      get_translation_ranges
                ((ifstream *)&local_220,&local_338,
                 (vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> *)
                 local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::allocator<char>::~allocator((allocator<char> *)((long)&elffile.current_file_pos + 7));
      ELFIO::elfio::elfio((elfio *)local_3c8);
      ELFIO::elfio::set_address_translation
                ((elfio *)local_3c8,
                 (vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> *)
                 local_318);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"/proc/",&local_429);
      std::operator+(&local_408,&local_428,argv[1]);
      std::operator+(&local_3e8,&local_408,"/mem");
      bVar2 = ELFIO::elfio::load((elfio *)local_3c8,&local_3e8,true);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator(&local_429);
      if (bVar2) {
        ELFIO::dump::header((ostream *)&std::cout,(elfio *)local_3c8);
        ELFIO::dump::segment_headers((ostream *)&std::cout,(elfio *)local_3c8);
        ELFIO::dump::segment_datas((ostream *)&std::cout,(elfio *)local_3c8);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Can\'t open ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"/proc/",&local_491)
        ;
        std::operator+(&local_470,&local_490,argv[1]);
        std::operator+(&local_450,&local_470,"/mem");
        poVar3 = std::operator<<(poVar3,(string *)&local_450);
        poVar3 = std::operator<<(poVar3," file");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator(&local_491);
      }
      argv_local._4_4_ = 0;
      ranges.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      ELFIO::elfio::~elfio((elfio *)local_3c8);
      std::vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::~vector
                ((vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> *)
                 local_318);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Can\'t open ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"/proc/",
                 (allocator<char> *)
                 ((long)&ranges.
                         super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_2d8,&local_2f8,argv[1]);
      std::operator+(&local_2b8,&local_2d8,"/maps");
      poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
      poVar3 = std::operator<<(poVar3," file");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&ranges.
                         super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      argv_local._4_4_ = 2;
      ranges.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::ifstream::~ifstream(&local_220);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: proc_mem <pid> <full_file_path>");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 3 ) {
        std::cout << "Usage: proc_mem <pid> <full_file_path>" << std::endl;
        return 1;
    }

    // Process file translation regions for the ELF file from /proc/pid/maps
    std::ifstream proc_maps( std::string( "/proc/" ) + argv[1] + "/maps" );
    if ( !proc_maps ) {
        std::cout << "Can't open "
                  << std::string( "/proc/" ) + argv[1] + "/maps" << " file"
                  << std::endl;
        return 2;
    }

    // Retrieve memory address translation ranges
    std::vector<address_translation> ranges;
    get_translation_ranges( proc_maps, argv[2], ranges );

    // Set address translation ranges prior loading ELF file
    elfio elffile;
    elffile.set_address_translation( ranges );

    // The 'load' will use the provided address translation now
    if ( elffile.load( std::string( "/proc/" ) + argv[1] + "/mem", true ) ) {
        dump::header( std::cout, elffile );
        dump::segment_headers( std::cout, elffile );
        dump::segment_datas( std::cout, elffile );
    }
    else {
        std::cout << "Can't open " << std::string( "/proc/" ) + argv[1] + "/mem"
                  << " file" << std::endl;
    }

    return 0;
}